

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

GCObject ** sweeplist(lua_State *L,GCObject **p,int countin,int *countout)

{
  byte bVar1;
  int iVar2;
  GCObject *o;
  
  bVar1 = L->l_G->currentwhite;
  iVar2 = 0;
  while ((o = ((GCObject *)p)->next, o != (GCObject *)0x0 && (iVar2 < countin))) {
    if ((o->marked & (bVar1 ^ 0x18)) == 0) {
      o->marked = o->marked & 0xc0 | bVar1 & 0x18;
    }
    else {
      ((GCObject *)p)->next = o->next;
      freeobj(L,o);
      o = (GCObject *)p;
    }
    iVar2 = iVar2 + 1;
    p = &o->next;
  }
  if (countout != (int *)0x0) {
    *countout = iVar2;
  }
  if (o == (GCObject *)0x0) {
    p = &o->next;
  }
  return &((GCObject *)p)->next;
}

Assistant:

static GCObject **sweeplist (lua_State *L, GCObject **p, int countin,
                             int *countout) {
  global_State *g = G(L);
  int ow = otherwhite(g);
  int i;
  int white = luaC_white(g);  /* current white */
  for (i = 0; *p != NULL && i < countin; i++) {
    GCObject *curr = *p;
    int marked = curr->marked;
    if (isdeadm(ow, marked)) {  /* is 'curr' dead? */
      *p = curr->next;  /* remove 'curr' from list */
      freeobj(L, curr);  /* erase 'curr' */
    }
    else {  /* change mark to 'white' */
      curr->marked = cast_byte((marked & ~maskgcbits) | white);
      p = &curr->next;  /* go to next element */
    }
  }
  if (countout)
    *countout = i;  /* number of elements traversed */
  return (*p == NULL) ? NULL : p;
}